

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O3

Col_Word Col_NewIntWord(intptr_t value)

{
  Cell *pacVar1;
  
  if (value + 0x4000000000000000 < 0) {
    pacVar1 = AllocCells(1);
    *(char *)((long)pacVar1 + 0) = '\x02';
    *(char *)((long)pacVar1 + 1) = '\0';
    *(char *)((long)pacVar1 + 2) = '\x04';
    *(char *)((long)pacVar1 + 3) = '\0';
    *(char *)((long)pacVar1 + 8) = '\0';
    *(char *)((long)pacVar1 + 9) = '\0';
    *(char *)((long)pacVar1 + 10) = '\0';
    *(char *)((long)pacVar1 + 0xb) = '\0';
    *(char *)((long)pacVar1 + 0xc) = '\0';
    *(char *)((long)pacVar1 + 0xd) = '\0';
    *(char *)((long)pacVar1 + 0xe) = '\0';
    *(char *)((long)pacVar1 + 0xf) = '\0';
    *(intptr_t *)(*pacVar1 + 0x10) = value;
  }
  else {
    pacVar1 = (Cell *)(value * 2 + 1);
  }
  return (Col_Word)pacVar1;
}

Assistant:

Col_Word
Col_NewIntWord(
    intptr_t value) /*!< Integer value of the word to create. */
{
    Col_Word word;  /* Resulting word in the general case. */

    /*
     * Return immediate value if possible.
     */

    if (value <= SMALLINT_MAX && value >= SMALLINT_MIN) {
        return WORD_SMALLINT_NEW(value);
    }

    /*
     * Create a new integer word.
     */

    word = (Col_Word) AllocCells(1);
    WORD_INTWRAP_INIT(word, 0, value);

    return word;
}